

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O2

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_LFO_Int<4>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  if (CH->_SLOT[2].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000) {
    this->int_cnt = (this->state).Inter_Cnt;
    iVar17 = 0;
    while (iVar17 < length) {
      iVar19 = CH->_SLOT[0].Fcnt;
      uVar16 = CH->_SLOT[1].Fcnt;
      iVar1 = CH->_SLOT[2].Fcnt;
      uVar13 = this->LFO_FREQ_UP[iVar17] * CH->FMS;
      if (uVar13 < 0x200) {
        iVar18 = CH->_SLOT[0].Finc + iVar19;
        iVar20 = CH->_SLOT[2].Finc + iVar1;
        iVar22 = CH->_SLOT[1].Finc + uVar16;
        iVar15 = CH->_SLOT[3].Finc;
      }
      else {
        iVar14 = (int)uVar13 >> 9;
        iVar15 = CH->_SLOT[0].Finc;
        iVar22 = CH->_SLOT[1].Finc;
        iVar18 = iVar15 + iVar19 + (iVar15 * iVar14 >> 9);
        iVar15 = CH->_SLOT[2].Finc;
        iVar20 = iVar15 + iVar1 + (iVar15 * iVar14 >> 9);
        iVar22 = (iVar22 * iVar14 >> 9) + uVar16 + iVar22;
        iVar15 = CH->_SLOT[3].Finc;
        iVar15 = (iVar14 * iVar15 >> 9) + iVar15;
      }
      iVar14 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[0].Fcnt = iVar18;
      CH->_SLOT[2].Fcnt = iVar20;
      CH->_SLOT[1].Fcnt = iVar22;
      CH->_SLOT[3].Fcnt = iVar15 + iVar14;
      iVar15 = this->LFO_ENV_UP[iVar17];
      iVar22 = CH->_SLOT[0].TLL;
      iVar18 = CH->_SLOT[0].Ecnt;
      iVar20 = (&ENV_TAB)[iVar18 >> 0x10];
      iVar8 = CH->_SLOT[0].AMS;
      iVar21 = CH->_SLOT[2].Ecnt;
      iVar2 = CH->_SLOT[2].TLL;
      iVar9 = CH->_SLOT[2].AMS;
      iVar3 = (&ENV_TAB)[iVar21 >> 0x10];
      iVar4 = CH->_SLOT[1].TLL;
      iVar5 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[1].Ecnt + 2)];
      iVar10 = CH->_SLOT[1].AMS;
      iVar6 = CH->_SLOT[3].TLL;
      iVar11 = CH->_SLOT[3].AMS;
      iVar7 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[3].Ecnt + 2)];
      iVar18 = iVar18 + CH->_SLOT[0].Einc;
      CH->_SLOT[0].Ecnt = iVar18;
      if (CH->_SLOT[0].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
        iVar21 = CH->_SLOT[2].Ecnt;
      }
      iVar21 = iVar21 + CH->_SLOT[2].Einc;
      CH->_SLOT[2].Ecnt = iVar21;
      if (CH->_SLOT[2].Ecmp <= iVar21) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar18 = CH->_SLOT[1].Ecnt + CH->_SLOT[1].Einc;
      CH->_SLOT[1].Ecnt = iVar18;
      if (CH->_SLOT[1].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar18 = CH->_SLOT[3].Ecnt + CH->_SLOT[3].Einc;
      CH->_SLOT[3].Ecnt = iVar18;
      if (CH->_SLOT[3].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar18 = CH->S0_OUT[0];
      iVar21 = CH->S0_OUT[1];
      iVar12 = CH->FB;
      CH->S0_OUT[1] = iVar18;
      iVar19 = *(int *)(*(long *)(SIN_TAB +
                                 ((uint)((iVar21 + iVar18 >> ((byte)iVar12 & 0x1f)) + iVar19) >> 0xb
                                 & 0x7ff8)) +
                       (long)(iVar22 + iVar20 + (iVar15 >> ((byte)iVar8 & 0x1f))) * 4);
      CH->S0_OUT[0] = iVar19;
      iVar19 = *(int *)(*(long *)(SIN_TAB + ((uint)(iVar1 + iVar19) >> 0xb & 0x7ff8)) +
                       (long)(iVar2 + iVar3 + (iVar15 >> ((byte)iVar9 & 0x1f))) * 4) +
               *(int *)(*(long *)(SIN_TAB +
                                 ((uint)(iVar14 + *(int *)(*(long *)(SIN_TAB +
                                                                    (uVar16 >> 0xb & 0x7ff8)) +
                                                          (long)(iVar4 + iVar5 +
                                                                (iVar15 >> ((byte)iVar10 & 0x1f))) *
                                                          4)) >> 0xb & 0x7ff8)) +
                       (long)(iVar6 + iVar7 + (iVar15 >> ((byte)iVar11 & 0x1f))) * 4) >> 0xe;
      CH->OUTd = iVar19;
      iVar1 = LIMIT_CH_OUT;
      if ((LIMIT_CH_OUT < iVar19) ||
         (iVar1 = -LIMIT_CH_OUT, SBORROW4(iVar19,-LIMIT_CH_OUT) != iVar19 + LIMIT_CH_OUT < 0)) {
        iVar19 = iVar1;
        CH->OUTd = iVar19;
      }
      uVar16 = this->int_cnt + (this->state).Inter_Step;
      this->int_cnt = uVar16;
      if ((uVar16 >> 0xe & 1) != 0) {
        uVar16 = uVar16 & 0x3fff;
        this->int_cnt = uVar16;
        iVar19 = (int)(uVar16 * CH->Old_OUTd + iVar19 * (uVar16 ^ 0x3fff)) >> 0xe;
        CH->Old_OUTd = iVar19;
        bufL[iVar17] = bufL[iVar17] + ((iVar19 * CH->PANVolumeL) / 0xffff & CH->LEFT);
        bufR[iVar17] = bufR[iVar17] + ((CH->PANVolumeR * CH->Old_OUTd) / 0xffff & CH->RIGHT);
        iVar17 = iVar17 + 1;
        iVar19 = CH->OUTd;
      }
      CH->Old_OUTd = iVar19;
    }
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_LFO_Int(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

	int_cnt = state.Inter_Cnt;
	int env_LFO, freq_LFO;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d LFO Int len = %d", algo, length);

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE_LFO();
		GET_CURRENT_ENV_LFO();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT_INT();
	}
}